

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::computeRhoG
          (Projection *this,FArrayBox *rhoFab,FArrayBox *phiFab,Geometry *geom,Orientation *outFaces
          ,int numOutFlowFaces,Real gravity)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  BCRec *pBVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  int iVar15;
  int iVar16;
  double *pdVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int i;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  int *lbc;
  long lVar44;
  ulong uVar45;
  bool bVar46;
  long lVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  double dVar56;
  Real rhog;
  double dVar57;
  double *local_170;
  int hi_bc [3];
  int lo_bc [3];
  
  dVar56 = -gravity;
  uVar43 = 0;
  uVar45 = (ulong)(uint)numOutFlowFaces;
  if (numOutFlowFaces < 1) {
    uVar45 = uVar43;
  }
  for (; uVar43 != uVar45; uVar43 = uVar43 + 1) {
    iVar2 = outFaces[uVar43].val;
    if (iVar2 % 3 == 2) {
      if (2 < iVar2 - 3U) {
        amrex::Abort_host(
                         "Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort"
                         );
      }
    }
    else {
      iVar3 = phiFab[uVar43].super_BaseFab<double>.domain.smallend.vect[0];
      lVar36 = (long)iVar3;
      iVar4 = phiFab[uVar43].super_BaseFab<double>.domain.smallend.vect[1];
      lVar33 = (long)iVar4;
      lVar11 = (long)phiFab[uVar43].super_BaseFab<double>.domain.smallend.vect[2];
      iVar38 = phiFab[uVar43].super_BaseFab<double>.domain.bigend.vect[0];
      iVar15 = phiFab[uVar43].super_BaseFab<double>.domain.bigend.vect[1];
      lVar29 = (long)phiFab[uVar43].super_BaseFab<double>.domain.bigend.vect[2];
      pdVar17 = phiFab[uVar43].super_BaseFab<double>.dptr;
      iVar18 = iVar38 - iVar3;
      lVar37 = (long)((iVar15 - iVar4) + 1);
      local_170 = rhoFab[uVar43].super_BaseFab<double>.dptr;
      uVar5 = rhoFab[uVar43].super_BaseFab<double>.domain.smallend.vect[0];
      lVar34 = (long)(int)uVar5;
      uVar6 = rhoFab[uVar43].super_BaseFab<double>.domain.smallend.vect[1];
      lVar39 = (long)(int)uVar6;
      lVar30 = (long)rhoFab[uVar43].super_BaseFab<double>.domain.smallend.vect[2];
      iVar16 = rhoFab[uVar43].super_BaseFab<double>.domain.bigend.vect[0];
      lVar35 = (long)(int)((rhoFab[uVar43].super_BaseFab<double>.domain.bigend.vect[1] - uVar6) + 1)
      ;
      dVar1 = (geom->super_CoordSys).dx[2];
      iVar25 = (geom->domain).smallend.vect[0];
      iVar7 = (geom->domain).smallend.vect[1];
      iVar8 = (geom->domain).bigend.vect[0];
      iVar9 = (geom->domain).bigend.vect[1];
      pBVar10 = this->phys_bc;
      for (lVar40 = 0; lVar40 != 3; lVar40 = lVar40 + 1) {
        lo_bc[lVar40] = scalar_bc[pBVar10->bc[lVar40]];
        hi_bc[lVar40] = scalar_bc[pBVar10->bc[lVar40 + 3]];
      }
      lVar41 = (long)(iVar18 + 1);
      lVar40 = (long)(int)((iVar16 - uVar5) + 1);
      if (iVar2 % 3 == 0) {
        bVar46 = iVar4 == iVar7;
        bVar48 = lo_bc[1] == 3;
        bVar49 = iVar9 + 1 == iVar15;
        bVar50 = hi_bc[1] == 3;
        bVar51 = lo_bc[1] == 4;
        bVar52 = hi_bc[1] == 4;
        bVar53 = lo_bc[1] == 2;
        bVar54 = hi_bc[1] == 2;
        iVar16 = iVar4 + 1;
        iVar38 = iVar4;
        if (bVar46 && ((bVar48 || bVar51) || bVar53)) {
          iVar38 = iVar16;
        }
        iVar25 = iVar15;
        if (bVar49 && ((bVar50 || bVar52) || bVar54)) {
          iVar25 = iVar15 + -1;
        }
        lVar26 = (long)(iVar15 - iVar4);
        lVar23 = (long)(iVar15 + -1);
        if (iVar2 + 2U < 5) {
          lVar21 = (long)(int)((iVar3 - uVar5) + 1);
          lVar44 = (long)iVar38;
          lVar12 = lVar21 * 8;
          lVar30 = ((lVar29 - lVar30) + -1) * lVar35;
          iVar38 = ~uVar6 + iVar38;
          lVar35 = lVar35 * lVar40;
          lVar27 = lVar30 * 8;
          lVar13 = (lVar44 * 8 + lVar30 * 8 + lVar39 * -8) * lVar40;
          lVar24 = lVar13 + lVar21 * 8 + (long)local_170;
          lVar30 = lVar36 * 8;
          lVar47 = lVar13 + lVar36 * 8 + lVar34 * -8 + (long)local_170;
          lVar42 = ((lVar29 + -1) - lVar11) * lVar37;
          pdVar14 = (double *)((lVar44 * 8 + lVar42 * 8 + lVar33 * -8) * lVar41 + (long)pdVar17);
          lVar37 = lVar37 * lVar41;
          lVar13 = lVar42 * 8;
          for (; lVar44 <= iVar25; lVar44 = lVar44 + 1) {
            lVar31 = (lVar27 + (long)iVar38 * 8) * lVar40;
            dVar57 = 0.0;
            lVar22 = 0;
            pdVar28 = pdVar14;
            for (lVar19 = lVar29; lVar11 < lVar19; lVar19 = lVar19 + -1) {
              dVar57 = dVar57 + ((*(double *)(lVar47 + lVar22) +
                                 *(double *)
                                  ((long)local_170 + lVar22 + lVar31 + lVar30 + lVar34 * -8)) * 0.5
                                 * 3.0 + (*(double *)(lVar24 + lVar22) +
                                         *(double *)((long)local_170 + lVar22 + lVar31 + lVar21 * 8)
                                         ) * -0.5) * 0.5 * dVar56 * dVar1;
              *pdVar28 = *pdVar28 + dVar57;
              lVar22 = lVar22 + lVar35 * -8;
              pdVar28 = pdVar28 + -lVar37;
            }
            iVar38 = iVar38 + 1;
            lVar24 = lVar24 + lVar40 * 8;
            lVar47 = lVar47 + lVar40 * 8;
            pdVar14 = pdVar14 + lVar41;
          }
          if (bVar46 && ((bVar48 || bVar51) || bVar53)) {
            if (bVar48 && bVar46) {
              pdVar28 = (double *)
                        ((lVar27 + (long)(int)(iVar4 + ~uVar6) * 8) * lVar40 + (long)local_170);
              pdVar14 = pdVar17 + lVar42 * lVar41;
              dVar57 = 0.0;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + (pdVar28[lVar36 - lVar34] * 3.0 - pdVar28[lVar21]) * 0.5 * dVar56
                                  * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
            else if (bVar51 && bVar46) {
              lVar24 = (lVar27 + (long)iVar16 * 8 + lVar39 * -8) * lVar40;
              lVar44 = (lVar33 * 8 + lVar27 + lVar39 * -8) * lVar40;
              pdVar14 = pdVar17 + lVar42 * lVar41;
              dVar57 = 0.0;
              pdVar28 = local_170;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)pdVar28 + lVar44 + lVar30 + lVar34 * -8) * 3.0
                                   - *(double *)((long)pdVar28 + lVar24 + lVar30 + lVar34 * -8)) *
                                   0.5 * 3.0 +
                                  (*(double *)((long)pdVar28 + lVar12 + lVar44) * 3.0 -
                                  *(double *)((long)pdVar28 + lVar24 + lVar12)) * -0.5) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
            else if (bVar53 && bVar46) {
              pdVar28 = (double *)((lVar33 * 8 + lVar27 + lVar39 * -8) * lVar40 + (long)local_170);
              pdVar14 = pdVar17 + lVar42 * lVar41;
              dVar57 = 0.0;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + (pdVar28[lVar36 - lVar34] * 3.0 - pdVar28[lVar21]) * 0.5 * dVar56
                                  * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
          }
          if (bVar49 && ((bVar50 || bVar52) || bVar54)) {
            if (bVar50 && bVar49) {
              local_170 = (double *)
                          ((long)local_170 + (lVar27 + (long)iVar15 * 8 + lVar39 * -8) * lVar40);
              pdVar17 = (double *)((long)pdVar17 + (lVar13 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (local_170[lVar36 - lVar34] * 3.0 - local_170[lVar21]) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
            else if (bVar52 && bVar49) {
              lVar33 = (lVar27 + (long)(int)((iVar15 - uVar6) + -2) * 8) * lVar40;
              lVar40 = (lVar27 + lVar23 * 8 + lVar39 * -8) * lVar40;
              pdVar17 = (double *)((long)pdVar17 + (lVar13 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)local_170 + lVar40 + lVar30 + lVar34 * -8) *
                                    3.0 - *(double *)
                                           ((long)local_170 + lVar33 + lVar30 + lVar34 * -8)) * 0.5
                                   * 3.0 + (*(double *)((long)local_170 + lVar12 + lVar40) * 3.0 -
                                           *(double *)((long)local_170 + lVar33 + lVar12)) * -0.5) *
                                  0.5 * dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
            else if (bVar54 && bVar49) {
              local_170 = (double *)((long)local_170 + (lVar27 + lVar23 * 8 + lVar39 * -8) * lVar40)
              ;
              pdVar17 = (double *)((long)pdVar17 + (lVar13 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (local_170[lVar36 - lVar34] * 3.0 - local_170[lVar21]) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
          }
        }
        else {
          lVar27 = (long)iVar38;
          lVar42 = (long)(int)(~uVar5 + iVar3);
          lVar13 = (long)(int)((iVar3 - uVar5) + -2);
          lVar36 = lVar13 * 8;
          lVar30 = ((lVar29 + -1) - lVar30) * lVar35;
          iVar38 = iVar38 + ~uVar6;
          lVar35 = lVar35 * lVar40;
          lVar24 = lVar30 * 8;
          lVar34 = (lVar27 * 8 + lVar30 * 8 + lVar39 * -8) * lVar40;
          lVar30 = lVar34 + lVar13 * 8;
          lVar34 = lVar34 + lVar42 * 8;
          lVar44 = lVar42 * 8;
          lVar21 = ((lVar29 + -1) - lVar11) * lVar37;
          lVar12 = lVar21 * 8;
          pdVar14 = (double *)((lVar27 * 8 + lVar21 * 8 + lVar33 * -8) * lVar41 + (long)pdVar17);
          lVar37 = lVar37 * lVar41;
          for (; lVar27 <= iVar25; lVar27 = lVar27 + 1) {
            lVar19 = (lVar24 + (long)iVar38 * 8) * lVar40;
            dVar57 = 0.0;
            pdVar28 = local_170;
            pdVar32 = pdVar14;
            for (lVar47 = lVar29; lVar11 < lVar47; lVar47 = lVar47 + -1) {
              dVar57 = dVar57 + ((*(double *)((long)pdVar28 + lVar34) +
                                 *(double *)((long)pdVar28 + lVar19 + lVar44)) * 0.5 * 3.0 +
                                (*(double *)((long)pdVar28 + lVar30) +
                                *(double *)((long)pdVar28 + lVar36 + lVar19)) * -0.5) * 0.5 * dVar56
                                * dVar1;
              *pdVar32 = *pdVar32 + dVar57;
              pdVar28 = pdVar28 + -lVar35;
              pdVar32 = pdVar32 + -lVar37;
            }
            iVar38 = iVar38 + 1;
            lVar30 = lVar30 + lVar40 * 8;
            lVar34 = lVar34 + lVar40 * 8;
            pdVar14 = pdVar14 + lVar41;
          }
          if (bVar46 && ((bVar48 || bVar51) || bVar53)) {
            if (bVar48 && bVar46) {
              pdVar28 = (double *)
                        ((lVar24 + (long)(int)(iVar4 + ~uVar6) * 8) * lVar40 + (long)local_170);
              pdVar14 = pdVar17 + lVar21 * lVar41;
              dVar57 = 0.0;
              for (lVar30 = lVar29; lVar11 < lVar30; lVar30 = lVar30 + -1) {
                dVar57 = dVar57 + (pdVar28[lVar42] * 3.0 - pdVar28[lVar13]) * 0.5 * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
            else if (bVar51 && bVar46) {
              lVar34 = (lVar24 + (long)iVar16 * 8 + lVar39 * -8) * lVar40;
              lVar33 = (lVar33 * 8 + lVar24 + lVar39 * -8) * lVar40;
              pdVar14 = pdVar17 + lVar21 * lVar41;
              dVar57 = 0.0;
              pdVar28 = local_170;
              for (lVar30 = lVar29; lVar11 < lVar30; lVar30 = lVar30 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)pdVar28 + lVar33 + lVar44) * 3.0 -
                                   *(double *)((long)pdVar28 + lVar34 + lVar44)) * 0.5 * 3.0 +
                                  (*(double *)((long)pdVar28 + lVar36 + lVar33) * 3.0 -
                                  *(double *)((long)pdVar28 + lVar34 + lVar36)) * -0.5) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
            else if (bVar53 && bVar46) {
              pdVar28 = (double *)((lVar33 * 8 + lVar24 + lVar39 * -8) * lVar40 + (long)local_170);
              pdVar14 = pdVar17 + lVar21 * lVar41;
              dVar57 = 0.0;
              for (lVar30 = lVar29; lVar11 < lVar30; lVar30 = lVar30 + -1) {
                dVar57 = dVar57 + (pdVar28[lVar42] * 3.0 - pdVar28[lVar13]) * 0.5 * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar37;
              }
            }
          }
          if (bVar49 && ((bVar50 || bVar52) || bVar54)) {
            if (bVar50 && bVar49) {
              local_170 = (double *)
                          ((long)local_170 + (lVar24 + (long)iVar15 * 8 + lVar39 * -8) * lVar40);
              pdVar17 = (double *)((long)pdVar17 + (lVar12 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (local_170[lVar42] * 3.0 - local_170[lVar13]) * 0.5 * dVar56 *
                                  dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
            else if (bVar52 && bVar49) {
              lVar30 = (lVar24 + (long)(int)((iVar15 - uVar6) + -2) * 8) * lVar40;
              lVar40 = (lVar24 + lVar23 * 8 + lVar39 * -8) * lVar40;
              pdVar17 = (double *)((long)pdVar17 + (lVar12 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)local_170 + lVar40 + lVar44) * 3.0 -
                                   *(double *)((long)local_170 + lVar30 + lVar44)) * 0.5 * 3.0 +
                                  (*(double *)((long)local_170 + lVar36 + lVar40) * 3.0 -
                                  *(double *)((long)local_170 + lVar30 + lVar36)) * -0.5) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
            else if (bVar54 && bVar49) {
              local_170 = (double *)((long)local_170 + (lVar24 + lVar23 * 8 + lVar39 * -8) * lVar40)
              ;
              pdVar17 = (double *)((long)pdVar17 + (lVar12 + lVar26 * 8) * lVar41);
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (local_170[lVar42] * 3.0 - local_170[lVar13]) * 0.5 * dVar56 *
                                  dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar37;
              }
            }
          }
        }
      }
      else {
        bVar48 = iVar3 == iVar25;
        bVar49 = lo_bc[0] == 3;
        bVar50 = iVar8 + 1 == iVar38;
        bVar51 = hi_bc[0] == 3;
        bVar52 = lo_bc[0] == 4;
        bVar53 = hi_bc[0] == 4;
        bVar54 = lo_bc[0] == 2;
        bVar55 = hi_bc[0] == 2;
        bVar46 = bVar48 && ((bVar49 || bVar52) || bVar54);
        iVar15 = iVar3;
        if (bVar48 && ((bVar49 || bVar52) || bVar54)) {
          iVar15 = iVar3 + 1;
        }
        bVar20 = bVar50 && ((bVar51 || bVar53) || bVar55);
        iVar16 = iVar38;
        if (bVar50 && ((bVar51 || bVar53) || bVar55)) {
          iVar16 = iVar38 + -1;
        }
        lVar26 = (long)(iVar38 + -1);
        lVar23 = (long)(iVar3 + 1);
        if (iVar2 + 2U < 5) {
          lVar44 = (long)iVar15;
          lVar12 = ((lVar29 - lVar30) + -1) * lVar35;
          lVar30 = lVar12 * 8;
          lVar27 = (long)(int)((iVar4 - uVar6) + 1) * 8;
          lVar24 = (lVar27 + lVar12 * 8) * lVar40;
          iVar15 = iVar15 + ~uVar5;
          lVar35 = lVar35 * lVar40;
          lVar47 = lVar24 + lVar44 * 8 + lVar34 * -8 + (long)local_170;
          lVar33 = lVar33 * 8;
          lVar12 = (lVar33 + lVar12 * 8 + lVar39 * -8) * lVar40;
          lVar42 = lVar12 + lVar44 * 8 + lVar34 * -8 + (long)local_170;
          lVar21 = (lVar29 + -1) - lVar11;
          lVar13 = lVar37 * lVar41;
          pdVar14 = pdVar17 + ((lVar21 * lVar13 + lVar44) - lVar36);
          for (; lVar44 <= iVar16; lVar44 = lVar44 + 1) {
            dVar57 = 0.0;
            lVar22 = 0;
            pdVar28 = pdVar14;
            for (lVar19 = lVar29; lVar11 < lVar19; lVar19 = lVar19 + -1) {
              dVar57 = dVar57 + ((*(double *)(lVar42 + lVar22) +
                                 *(double *)((long)local_170 + lVar22 + (long)iVar15 * 8 + lVar12))
                                 * 0.5 * 3.0 +
                                (*(double *)(lVar47 + lVar22) +
                                *(double *)((long)local_170 + lVar22 + (long)iVar15 * 8 + lVar24)) *
                                -0.5) * 0.5 * dVar56 * dVar1;
              *pdVar28 = *pdVar28 + dVar57;
              lVar22 = lVar22 + lVar35 * -8;
              pdVar28 = pdVar28 + -lVar13;
            }
            iVar15 = iVar15 + 1;
            lVar47 = lVar47 + 8;
            lVar42 = lVar42 + 8;
            pdVar14 = pdVar14 + 1;
          }
          if (bVar46) {
            if (bVar49 && bVar48) {
              pdVar14 = local_170 + (int)(iVar3 + ~uVar5);
              pdVar28 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar36 = lVar29; lVar11 < lVar36; lVar36 = lVar36 + -1) {
                dVar57 = dVar57 + (*(double *)
                                    ((long)pdVar14 + (lVar33 + lVar30 + lVar39 * -8) * lVar40) * 3.0
                                  - *(double *)((long)pdVar14 + (lVar27 + lVar30) * lVar40)) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar28 = *pdVar28 + dVar57;
                pdVar14 = pdVar14 + -lVar35;
                pdVar28 = pdVar28 + -lVar13;
              }
            }
            else if (bVar52 && bVar48) {
              lVar12 = lVar34 * -8;
              lVar24 = (lVar30 + lVar27) * lVar40;
              lVar44 = lVar24 + lVar23 * 8 + (long)local_170;
              lVar47 = lVar35 * -8;
              lVar24 = lVar24 + lVar36 * 8 + (long)local_170;
              lVar42 = (lVar33 + lVar30 + lVar39 * -8) * lVar40;
              lVar19 = lVar42 + lVar23 * 8 + (long)local_170;
              lVar23 = lVar42 + lVar36 * 8 + (long)local_170;
              pdVar14 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar36 = lVar29; lVar11 < lVar36; lVar36 = lVar36 + -1) {
                dVar57 = dVar57 + ((*(double *)(lVar23 + lVar12) * 3.0 -
                                   *(double *)(lVar19 + lVar12)) * 0.5 * 3.0 +
                                  (*(double *)(lVar24 + lVar12) * 3.0 - *(double *)(lVar44 + lVar12)
                                  ) * -0.5) * 0.5 * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                lVar44 = lVar44 + lVar47;
                lVar24 = lVar24 + lVar47;
                lVar19 = lVar19 + lVar47;
                lVar23 = lVar23 + lVar47;
                pdVar14 = pdVar14 + -lVar13;
              }
            }
            else if (bVar54 && bVar48) {
              pdVar28 = local_170 + (lVar36 - lVar34);
              pdVar14 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar36 = lVar29; lVar11 < lVar36; lVar36 = lVar36 + -1) {
                dVar57 = dVar57 + (*(double *)
                                    ((long)pdVar28 + (lVar33 + lVar30 + lVar39 * -8) * lVar40) * 3.0
                                  - *(double *)((long)pdVar28 + (lVar27 + lVar30) * lVar40)) * 0.5 *
                                  dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar13;
              }
            }
          }
          if (bVar20) {
            if (bVar51 && bVar50) {
              local_170 = local_170 + (iVar38 - lVar34);
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (*(double *)
                                    ((long)local_170 + (lVar33 + lVar30 + lVar39 * -8) * lVar40) *
                                   3.0 - *(double *)((long)local_170 + (lVar27 + lVar30) * lVar40))
                                  * 0.5 * dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar13;
              }
            }
            else if (bVar53 && bVar50) {
              lVar36 = (long)(int)((iVar38 - uVar5) + -2);
              lVar23 = (lVar27 + lVar30) * lVar40;
              lVar40 = (lVar33 + lVar30 + lVar39 * -8) * lVar40;
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)local_170 + lVar40 + lVar26 * 8 + lVar34 * -8)
                                    * 3.0 - *(double *)((long)local_170 + lVar40 + lVar36 * 8)) *
                                   0.5 * 3.0 +
                                  (*(double *)((long)local_170 + lVar23 + lVar26 * 8 + lVar34 * -8)
                                   * 3.0 - *(double *)((long)local_170 + lVar23 + lVar36 * 8)) *
                                  -0.5) * 0.5 * dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar13;
              }
            }
            else if (bVar55 && bVar50) {
              local_170 = local_170 + (lVar26 - lVar34);
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (*(double *)
                                    ((long)local_170 + (lVar33 + lVar30 + lVar39 * -8) * lVar40) *
                                   3.0 - *(double *)((long)local_170 + (lVar27 + lVar30) * lVar40))
                                  * 0.5 * dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar13;
              }
            }
          }
        }
        else {
          lVar27 = (long)iVar15;
          lVar13 = (long)(int)((iVar4 - uVar6) + -2);
          lVar33 = ((lVar29 + -1) - lVar30) * lVar35;
          lVar30 = lVar33 * 8;
          iVar15 = ~uVar5 + iVar15;
          lVar35 = lVar35 * lVar40;
          lVar42 = (long)(int)(~uVar6 + iVar4) * 8;
          lVar39 = (lVar42 + lVar33 * 8) * lVar40;
          lVar24 = lVar39 + lVar27 * 8 + lVar34 * -8 + (long)local_170;
          lVar21 = (lVar29 + -1) - lVar11;
          lVar12 = lVar37 * lVar41;
          pdVar14 = pdVar17 + ((lVar21 * lVar12 + lVar27) - lVar36);
          for (; lVar27 <= iVar16; lVar27 = lVar27 + 1) {
            dVar57 = 0.0;
            lVar47 = 0;
            pdVar28 = pdVar14;
            for (lVar44 = lVar29; lVar11 < lVar44; lVar44 = lVar44 + -1) {
              dVar57 = dVar57 + ((*(double *)((long)local_170 + lVar47 + (long)iVar15 * 8 + lVar39)
                                 + *(double *)(lVar24 + lVar47)) * 0.5 * 3.0 +
                                (*(double *)(lVar24 + lVar47) +
                                *(double *)
                                 ((long)local_170 +
                                 lVar47 + (long)iVar15 * 8 + (lVar13 * 8 + lVar33 * 8) * lVar40)) *
                                -0.5) * 0.5 * dVar56 * dVar1;
              *pdVar28 = *pdVar28 + dVar57;
              lVar47 = lVar47 + lVar35 * -8;
              pdVar28 = pdVar28 + -lVar12;
            }
            iVar15 = iVar15 + 1;
            lVar24 = lVar24 + 8;
            pdVar14 = pdVar14 + 1;
          }
          if (bVar46) {
            if (bVar49 && bVar48) {
              pdVar28 = (double *)((lVar30 + lVar42) * lVar40 + (long)local_170);
              pdVar14 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + (pdVar28[(int)(~uVar5 + iVar3)] * 3.0 -
                                  pdVar28[(int)((iVar3 - uVar5) + -2)]) * 0.5 * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar12;
              }
            }
            else if (bVar52 && bVar48) {
              lVar39 = lVar34 * -8;
              lVar33 = (lVar30 + lVar13 * 8) * lVar40;
              lVar44 = lVar33 + lVar23 * 8 + (long)local_170;
              lVar24 = lVar35 * -8;
              lVar27 = lVar33 + lVar36 * 8 + (long)local_170;
              lVar33 = (lVar42 + lVar30) * lVar40;
              lVar23 = lVar33 + lVar23 * 8 + (long)local_170;
              lVar36 = lVar33 + lVar36 * 8 + (long)local_170;
              pdVar14 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + ((*(double *)(lVar36 + lVar39) * 3.0 -
                                   *(double *)(lVar23 + lVar39)) * 0.5 * 3.0 +
                                  (*(double *)(lVar27 + lVar39) * 3.0 - *(double *)(lVar44 + lVar39)
                                  ) * -0.5) * 0.5 * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                lVar44 = lVar44 + lVar24;
                lVar27 = lVar27 + lVar24;
                lVar23 = lVar23 + lVar24;
                lVar36 = lVar36 + lVar24;
                pdVar14 = pdVar14 + -lVar12;
              }
            }
            else if (bVar54 && bVar48) {
              pdVar28 = local_170 + (lVar36 - lVar34);
              pdVar14 = pdVar17 + lVar21 * lVar37 * lVar41;
              dVar57 = 0.0;
              for (lVar33 = lVar29; lVar11 < lVar33; lVar33 = lVar33 + -1) {
                dVar57 = dVar57 + (*(double *)((long)pdVar28 + (lVar30 + lVar42) * lVar40) * 3.0 -
                                  *(double *)((long)pdVar28 + (lVar30 + lVar13 * 8) * lVar40)) * 0.5
                                  * dVar56 * dVar1;
                *pdVar14 = *pdVar14 + dVar57;
                pdVar28 = pdVar28 + -lVar35;
                pdVar14 = pdVar14 + -lVar12;
              }
            }
          }
          if (bVar20) {
            lVar33 = lVar13 * 8 + lVar30;
            if (bVar51 && bVar50) {
              local_170 = local_170 + (iVar38 - lVar34);
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (*(double *)((long)local_170 + (lVar30 + lVar42) * lVar40) * 3.0 -
                                  *(double *)((long)local_170 + lVar33 * lVar40)) * 0.5 * dVar56 *
                                  dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar12;
              }
            }
            else if (bVar53 && bVar50) {
              lVar36 = (long)(int)((iVar38 - uVar5) + -2);
              lVar30 = (lVar30 + lVar42) * lVar40;
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + ((*(double *)((long)local_170 + lVar26 * 8 + lVar30 + lVar34 * -8)
                                    * 3.0 - *(double *)((long)local_170 + lVar36 * 8 + lVar30)) *
                                   0.5 * 3.0 +
                                  (*(double *)
                                    ((long)local_170 + lVar33 * lVar40 + lVar26 * 8 + lVar34 * -8) *
                                   3.0 - *(double *)((long)local_170 + lVar33 * lVar40 + lVar36 * 8)
                                  ) * -0.5) * 0.5 * dVar56 * dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar12;
              }
            }
            else if (bVar55 && bVar50) {
              local_170 = local_170 + (lVar26 - lVar34);
              pdVar17 = pdVar17 + lVar21 * lVar37 * lVar41 + (long)iVar18;
              dVar57 = 0.0;
              for (; lVar11 < lVar29; lVar29 = lVar29 + -1) {
                dVar57 = dVar57 + (*(double *)((long)local_170 + (lVar30 + lVar42) * lVar40) * 3.0 -
                                  *(double *)((long)local_170 + lVar33 * lVar40)) * 0.5 * dVar56 *
                                  dVar1;
                *pdVar17 = *pdVar17 + dVar57;
                local_170 = local_170 + -lVar35;
                pdVar17 = pdVar17 + -lVar12;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
Projection::computeRhoG(FArrayBox*         rhoFab,
			FArrayBox*         phiFab,
			const Geometry&    geom,
			Orientation*       outFaces,
			int                numOutFlowFaces,
			Real               gravity)
{
    AMREX_ASSERT(std::fabs(gravity) > 0.);

    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
      int outDir             = outFaces[iface].coordDir();
      Orientation::Side side = outFaces[iface].faceDir();

      if (outDir == (AMREX_SPACEDIM-1))
      {
	  if (side == Orientation::high) {
	    //
	    // Hydrostatic pressure == 0 here, given IAMR definition of gravity.
	    // Do nothing, since phi already initialized to zero
	    //
	  } else {
	    amrex::Abort("Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort");
	  }
      }
      else // integrate rho * g* dh
      {
	  const auto   lo = amrex::lbound(phiFab[iface].box());
	  const auto   hi = amrex::ubound(phiFab[iface].box());
	  const auto& phi = phiFab[iface].array();
	  const auto& rho = rhoFab[iface].array();
	  const Real dh = geom.CellSize(AMREX_SPACEDIM-1);

	  auto add_rhog = [gravity, dh] ( Real rho1, Real rho2,
					  Real& rhog_i, Real& phi_i )
	  {
	    Real rhoExt = 0.5*(3.*rho1-rho2);
	    rhog_i -= gravity * rhoExt * dh;
	    phi_i  += rhog_i;
	  };


#if (AMREX_SPACEDIM == 2)
	  //
	  // Only possibilities are XLO face or XHI
	  //
	  // Ok to only use low index of phi because phi is only one
	  // node wide in i-direction.
	  //
	  AMREX_ASSERT( lo.x==hi.x );
	  int i = lo.x;

	  Real rhog = 0.;
	  //
	  // Note that the integral here prevents parallelization
	  //
	  if (side == Orientation::low)
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i,j,0),rho(i+1,j,0),rhog,phi(i,j,0));
	    }
	  }
	  else
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i-1,j,0),rho(i-2,j,0),rhog,phi(i,j,0));
	    }
	  }
#else
	  const Box& domain = geom.Domain();
	  const auto domlo = amrex::lbound(domain);
	  const auto domhi = amrex::ubound(domain);

	  // fixme? Could make use of NSB::m_bcrec_scalars here.
	  int        lo_bc[AMREX_SPACEDIM];
	  int        hi_bc[AMREX_SPACEDIM];
	  //
	  // change from phys_bcs of Inflow, SlipWall, etc.
	  // to mathematical bcs of EXT_DIR, FOEXTRAP, etc.
	  //
	  for (int i = 0; i < AMREX_SPACEDIM; i++)
	  {
	      const int* lbc = phys_bc->lo();
	      const int* hbc = phys_bc->hi();

	      lo_bc[i]=scalar_bc[lbc[i]];
	      hi_bc[i]=scalar_bc[hbc[i]];
	  }

	  //
	  // fixme? - TODO: Could parallelize here by dividing the loop over i (or j)
	  // only and thus the k integration stays intact. However, would want to move
	  // this declaration of rho_i, rho_ii to ensure each k integration has it's own
	  // copy.
	  //
	  Real rho_i, rho_ii;

	  if ( outDir == int(Direction::x) )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.x==hi.x );
	      int i = lo.x;

	      bool has_extdir_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::foextrap);

	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over j accordingly.
	      //
	      int jlo, jhi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		jlo = lo.y+1;
	      } else {
		jlo = lo.y;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		jhi = hi.y-1;
	      } else {
		jhi = hi.y;
	      }

	      //
	      // xlo face
	      //
	      if (side == Orientation::low)
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i  = 0.5 * (rho(i  ,j,k) + rho(i  ,j-1,k));
		    rho_ii = 0.5 * (rho(i+1,j,k) + rho(i+1,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j,k) - rho(i  ,j+1,k));
		      rho_ii = 0.5*(3.*rho(i+1,j,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j-1,k) - rho(i  ,j-2,k));
		      rho_ii = 0.5*(3.*rho(i+1,j-1,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // xhi face
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i-1,j,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i-2,j,k) + rho(i-2,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j,k) - rho(i-1,j+1,k));
		      rho_ii = 0.5*(3.*rho(i-2,j,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-1,j-2,k));
		      rho_ii = 0.5*(3.*rho(i-2,j-1,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	  }
	  else // ( outDir == Direction::y )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.y==hi.y );
	      int j = lo.y;

	      bool has_extdir_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::foextrap);
	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over i accordingly.
	      //
	      int ilo, ihi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		ilo = lo.x+1;
	      } else {
		ilo = lo.x;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		ihi = hi.x-1;
	      } else {
		ihi = hi.x;
	      }
	      //
	      // ylo face
	      //
	      if (side == Orientation::low)
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j  ,k) + rho(i-1,j ,k));
		    rho_ii = 0.5 * (rho(i,j+1,k) + rho(i-1,j+1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute x-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j  ,k) - rho(i+1,j  ,k));
		      rho_ii = 0.5*(3.*rho(i,j+1,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j  ,k) - rho(i-2,j  ,k));
		      rho_ii = 0.5*(3.*rho(i-1,j+1,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // yhi face
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j-1,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i,j-1,k) + rho(i-1,j-2,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j-1,k) - rho(i+1,j-1,k));
		      rho_ii = 0.5*(3.*rho(i,j-2,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-2,j-1,k));
		      rho_ii = 0.5*(3.*rho(i-1,j-2,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-1,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      } // endif over hi/low sides
	  } // endif over directions
#endif
      } // endif integrate rho*g*dh
    } // end loop over outflow faces
}